

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3ResolveOrderGroupBy(Parse *pParse,Select *pSelect,ExprList *pOrderBy,char *zType)

{
  ushort uVar1;
  ExprList *pEList;
  int iVar2;
  ExprList_item *pEVar3;
  int i;
  
  iVar2 = 0;
  if ((pOrderBy != (ExprList *)0x0) && (iVar2 = 0, pParse->db->mallocFailed == '\0')) {
    iVar2 = pOrderBy->nExpr;
    if (pParse->db->aLimit[2] < iVar2) {
      sqlite3ErrorMsg(pParse,"too many terms in %s BY clause",zType);
LAB_0016ca0f:
      iVar2 = 1;
    }
    else {
      pEList = pSelect->pEList;
      pEVar3 = pOrderBy->a;
      for (i = 1; i + -1 < iVar2; i = i + 1) {
        uVar1 = (pEVar3->u).x.iOrderByCol;
        if (uVar1 != 0) {
          iVar2 = pEList->nExpr;
          if (iVar2 < (int)(uint)uVar1) {
            resolveOutOfRangeError(pParse,zType,i,iVar2);
            goto LAB_0016ca0f;
          }
          resolveAlias(pParse,pEList,uVar1 - 1,pEVar3->pExpr,zType,0);
          iVar2 = pOrderBy->nExpr;
        }
        pEVar3 = pEVar3 + 1;
      }
      iVar2 = 0;
    }
  }
  return iVar2;
}

Assistant:

SQLITE_PRIVATE int sqlite3ResolveOrderGroupBy(
  Parse *pParse,        /* Parsing context.  Leave error messages here */
  Select *pSelect,      /* The SELECT statement containing the clause */
  ExprList *pOrderBy,   /* The ORDER BY or GROUP BY clause to be processed */
  const char *zType     /* "ORDER" or "GROUP" */
){
  int i;
  sqlite3 *db = pParse->db;
  ExprList *pEList;
  struct ExprList_item *pItem;

  if( pOrderBy==0 || pParse->db->mallocFailed ) return 0;
  if( pOrderBy->nExpr>db->aLimit[SQLITE_LIMIT_COLUMN] ){
    sqlite3ErrorMsg(pParse, "too many terms in %s BY clause", zType);
    return 1;
  }
  pEList = pSelect->pEList;
  assert( pEList!=0 );  /* sqlite3SelectNew() guarantees this */
  for(i=0, pItem=pOrderBy->a; i<pOrderBy->nExpr; i++, pItem++){
    if( pItem->u.x.iOrderByCol ){
      if( pItem->u.x.iOrderByCol>pEList->nExpr ){
        resolveOutOfRangeError(pParse, zType, i+1, pEList->nExpr);
        return 1;
      }
      resolveAlias(pParse, pEList, pItem->u.x.iOrderByCol-1, pItem->pExpr,
                   zType,0);
    }
  }
  return 0;
}